

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O1

void __thiscall CIdExp::CIdExp(CIdExp *this,char *name)

{
  allocator local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (this->super_IExpression).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00182180;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->isInstance = false;
  std::__cxx11::string::string((string *)local_38,name,&local_39);
  std::__cxx11::string::operator=((string *)&this->name,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

CIdExp::CIdExp( char *name) {
    this->name = std::string( name );
}